

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestMotorPowerControl(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  int row;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  char *__format;
  byte bVar14;
  bool bVar15;
  char buf [100];
  
  AmpIO::WriteWatchdogPeriod(Board,0);
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar4 = std::operator<<(poVar4,"=== Motor Power Control ===");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = 0xc0f0f;
  if (qlaNum == 2) {
    uVar5 = 0x48000;
  }
  uVar7 = 0xc0000;
  if (qlaNum == 2) {
    uVar7 = 0x48000;
  }
  if (qlaNum == 1) {
    uVar5 = 0x44000;
    uVar7 = 0x44000;
  }
  row = curLine + 1;
  do {
    AmpIO::WritePowerEnable(Board,true);
    Amp1394Console::Print(curLine,9,"Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])(Port);
    uVar1 = AmpIO::GetStatus(Board);
    poVar4 = std::operator<<((ostream *)logFile,"   Enable motor power: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if ((uVar1 & uVar5) == uVar7) {
      poVar4 = std::operator<<((ostream *)logFile," - PASS");
      std::endl<char,std::char_traits<char>>(poVar4);
      sprintf(buf,"PASS (%08lx)",(ulong)uVar1);
      bVar9 = true;
LAB_0010701d:
      Amp1394Console::Print(curLine,0x1e,buf);
      uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
      uVar7 = 0x4ffff;
      if (qlaNum == 2) {
        uVar7 = 0x8000;
      }
      uVar3 = 0x40000;
      if (qlaNum == 2) {
        uVar3 = 0x8000;
      }
      uVar6 = 0x4000;
      if (qlaNum != 1) {
        uVar6 = uVar3;
      }
      uVar3 = 0x4000;
      if (qlaNum != 1) {
        uVar3 = uVar7;
      }
      bVar14 = (uVar1 & uVar3) != uVar6 | bVar9;
      if (bVar14 == 0) {
        poVar4 = std::operator<<((ostream *)logFile,
                                 "   Continuing test, ignoring \'motor voltage good\' feedback");
        std::endl<char,std::char_traits<char>>(poVar4);
        Amp1394Console::Print(row,9,"Continuing test, ignoring \'motor voltage good\' feedback");
        row = curLine + 2;
      }
      Amp1394Console::Refresh();
      iVar12 = (uint)(qlaNum == 2) * 4;
      if (uVar2 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0xf);
      }
      else {
        for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
          AmpIO::WriteAmpEnableAxis(Board,iVar13 + iVar12,true);
        }
      }
      Amp1394_Sleep(0.006);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar2 < 8) {
        uVar1 = AmpIO::GetStatus(Board);
        poVar4 = std::operator<<((ostream *)logFile,"   Amplifier enable: ");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        uVar7 = (uint)bVar14 << 0x13 | 0x40f0f;
        if ((uVar7 & ~uVar1) == 0) {
          poVar4 = std::operator<<((ostream *)logFile," - PASS");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Enable power amplifiers - PASS (%08lx)";
        }
        else {
          poVar4 = std::operator<<((ostream *)logFile," - FAIL");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Enable power amplifiers - FAIL (%08lx)";
          bVar9 = false;
        }
        sprintf(buf,pcVar10,(ulong)uVar1);
      }
      else {
        std::operator<<((ostream *)logFile,"   Amplifier enable: ");
        uVar7 = 0x117838;
        uVar8 = 0;
        for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
          bVar15 = AmpIO::GetAmpEnable(Board,iVar13 + iVar12);
          if (bVar15) {
            std::operator<<((ostream *)logFile,"1 ");
            uVar8 = uVar8 | (uint)(1 << ((byte)iVar13 & 0x1f));
          }
          else {
            std::operator<<((ostream *)logFile,"0 ");
            bVar9 = false;
          }
        }
        if (uVar8 == 0xf) {
          poVar4 = std::operator<<((ostream *)logFile," - PASS");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Enable power amplifiers - PASS (%04lx)";
          uVar8 = 0xf;
        }
        else {
          poVar4 = std::operator<<((ostream *)logFile," - FAIL");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Enable power amplifiers - FAIL (%04lx)";
        }
        sprintf(buf,pcVar10,uVar8);
      }
      iVar13 = 0;
      Amp1394Console::Print(row,9,buf);
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      if (uVar2 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0);
      }
      else {
        for (; iVar13 != 4; iVar13 = iVar13 + 1) {
          AmpIO::WriteAmpEnableAxis(Board,iVar13 + iVar12,false);
        }
      }
      Amp1394_Sleep(0.001);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar2 < 8) {
        uVar1 = AmpIO::GetStatus(Board);
        poVar4 = std::operator<<((ostream *)logFile,"   Amplifier disable: ");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if (((uVar1 ^ 0xc0000) & uVar7) == 0) {
          poVar4 = std::operator<<((ostream *)logFile," - PASS");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Disable power amplifiers - PASS (%08lx)";
        }
        else {
          poVar4 = std::operator<<((ostream *)logFile," - FAIL");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Disable power amplifiers - FAIL (%08lx)";
          bVar9 = false;
        }
        sprintf(buf,pcVar10,(ulong)uVar1);
      }
      else {
        std::operator<<((ostream *)logFile,"   Amplifier disable: ");
        uVar8 = 0;
        for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
          bVar15 = AmpIO::GetAmpEnable(Board,iVar13 + iVar12);
          if (bVar15) {
            std::operator<<((ostream *)logFile,"1 ");
            uVar8 = uVar8 | (uint)(1 << ((byte)iVar13 & 0x1f));
            bVar9 = false;
          }
          else {
            std::operator<<((ostream *)logFile,"0 ");
          }
        }
        if (uVar8 == 0) {
          poVar4 = std::operator<<((ostream *)logFile," - PASS");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Disable power amplifiers - PASS (%04lx)";
          uVar8 = 0;
        }
        else {
          poVar4 = std::operator<<((ostream *)logFile," - FAIL");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar10 = "Disable power amplifiers - FAIL (%04lx)";
        }
        sprintf(buf,pcVar10,uVar8);
      }
      Amp1394Console::Print(row + 1,9,buf);
      AmpIO::WritePowerEnable(Board,false);
      Amp1394Console::Print(row + 2,9,"Disable motor power -");
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      (*Port->_vptr_BasePort[0x1d])();
      uVar1 = AmpIO::GetStatus(Board);
      poVar4 = std::operator<<((ostream *)logFile,"   Disable motor power: ");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      bVar15 = (uVar5 & uVar1) == 0;
      pcVar10 = " - FAIL";
      if (bVar15) {
        pcVar10 = " - PASS";
      }
      pcVar11 = "Enable power amplifiers - FAIL (%08lx)";
      if (bVar15) {
        pcVar11 = "Enable power amplifiers - PASS (%08lx)";
      }
      if (!bVar15) {
        bVar9 = false;
      }
      poVar4 = std::operator<<((ostream *)logFile,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar4);
      sprintf(buf,pcVar11 + 0x1a,(ulong)uVar1);
      Amp1394Console::Print(row + 2,0x1f,buf);
      if (qlaNum == 0) {
        AmpIO::WriteSafetyRelay(Board,true);
        Amp1394_Sleep(0.01);
        poVar4 = std::operator<<((ostream *)logFile,"   Enable safety relay: ");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        BoardIO::ReadStatus((BoardIO *)Board);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        bVar15 = AmpIO::ReadSafetyRelayStatus(Board);
        pcVar10 = " - FAIL";
        pcVar11 = " - FAIL";
        if (bVar15) {
          pcVar11 = " - PASS";
        }
        __format = "Enable safety relay - FAIL (%08x)";
        if (bVar15) {
          __format = "Enable safety relay - PASS (%08x)";
        }
        else {
          bVar9 = false;
        }
        poVar4 = std::operator<<((ostream *)logFile,pcVar11);
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar1 = BoardIO::ReadStatus((BoardIO *)Board);
        sprintf(buf,__format,(ulong)uVar1);
        Amp1394Console::Print(row + 3,9,buf);
        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);
        AmpIO::WriteSafetyRelay(Board,false);
        Amp1394_Sleep(0.001);
        (*Port->_vptr_BasePort[0x1d])();
        uVar1 = AmpIO::GetStatus(Board);
        poVar4 = std::operator<<((ostream *)logFile,"   Disable safety relay: ");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        bVar15 = (uVar1 & 0x30000) == 0;
        if (bVar15) {
          pcVar10 = " - PASS";
        }
        pcVar11 = "Disable safety relay - FAIL (%08lx)";
        if (bVar15) {
          pcVar11 = "Disable safety relay - PASS (%08lx)";
        }
        if (!bVar15) {
          bVar9 = false;
        }
        poVar4 = std::operator<<((ostream *)logFile,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar4);
        sprintf(buf,pcVar11,(ulong)uVar1);
        Amp1394Console::Print(row + 4,9,buf);
      }
      else {
        poVar4 = std::operator<<((ostream *)logFile,"   Skipping safety relay tests for DQLA");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      AmpIO::WriteWatchdogPeriod(Board,0xffff);
      return bVar9;
    }
    sprintf(buf,"FAIL (%08lx) - is motor power connected?",(ulong)uVar1);
    Amp1394Console::Print(curLine,0x1e,buf);
    Amp1394Console::Print(row,9,"Do you want to retry (y/n)? ");
    Amp1394Console::GetString(buf,100);
    if ((buf[0] & 0xdfU) != 0x59) {
      poVar4 = std::operator<<((ostream *)logFile," - FAIL");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar12 = curLine + 2;
      bVar9 = false;
      curLine = row;
      row = iVar12;
      goto LAB_0010701d;
    }
    Amp1394Console::Print(row,9,"                               ");
    Amp1394Console::Print(curLine,0x1e,"                                           ");
    poVar4 = std::operator<<((ostream *)logFile," - Retrying");
    std::endl<char,std::char_traits<char>>(poVar4);
  } while( true );
}

Assistant:

bool TestMotorPowerControl(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    bool pass = true;
    bool ignoreMV = false;     // ignore "motor voltage good" feedback
    unsigned long mask;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    logFile << std::endl << "=== Motor Power Control ===" << std::endl;
 retry:
    // Enabling motor power supply
    Board.WritePowerEnable(true);
    Amp1394Console::Print(curLine, 9, "Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Enable motor power: " << std::hex << status;
    // Note: QLA implementation also verifies that amp enable is off
    uint32_t status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    uint32_t status_goal = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0000;
    if ((status & status_mask) != status_goal) {
        sprintf(buf, "FAIL (%08lx) - is motor power connected?", status);
        Amp1394Console::Print(curLine++, 30, buf);
        Amp1394Console::Print(curLine, 9, "Do you want to retry (y/n)? ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if ((buf[0] == 'y') || (buf[0] == 'Y')) {
            Amp1394Console::Print(curLine, 9, "                               ");
            curLine -= 1;
            Amp1394Console::Print(curLine, 30, "                                           ");
            logFile << " - Retrying" << std::endl;
            goto retry;
        }
        logFile << " - FAIL" << std::endl;
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 30, buf);

    uint32_t fver = Board.GetFirmwareVersion();

    status_mask = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x0004ffff;
    status_goal = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x00040000;
    if (!pass && (status & status_mask) == status_goal) {
        logFile << "   Continuing test, ignoring 'motor voltage good' feedback" << std::endl;
        Amp1394Console::Print(curLine++, 9, "Continuing test, ignoring 'motor voltage good' feedback");
        ignoreMV = true;
    }
    Amp1394Console::Refresh();

    unsigned int i;
    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    Amp1394_Sleep(0.006);       // QLA Rev 1.5+ may have delay up to 5.3 ms
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier enable: " << std::hex << status;
        mask = ignoreMV ? 0x00040f0f : 0x000c0f0f;
        if ((status&mask) != (0x000c0f0f&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier enable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
            }
            else {
                logFile << "0 ";
                pass = false;
            }
        }
        if (status != 0x000f) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);    // wait 1 second (LEDs should be ON)

    // Turning amplifiers off
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Amp1394_Sleep(0.001);
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier disable: " << std::hex << status;
        if ((status&mask) != (0x000c0000&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier disable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
                pass = false;
            }
            else {
                logFile << "0 ";
            }
        }
        if (status != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Board.WritePowerEnable(false);
    Amp1394Console::Print(curLine, 9, "Disable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Disable motor power: " << std::hex << status;
    status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    if ((status&status_mask) != 0) {
        logFile << " - FAIL" << std::endl;
        sprintf(buf, "FAIL (%08lx)", status);
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    if (qlaNum == 0) {
        // Turn on safety relay
        Board.WriteSafetyRelay(true);
        Amp1394_Sleep(0.01);   // 10 ms
        logFile << "   Enable safety relay: " << std::hex << Board.ReadStatus();
        if (!Board.ReadSafetyRelayStatus()) {
            logFile << " - FAIL" << std::endl;
            // Old QLA boards (before Rev 1.3) require +12V to be connected to relay
            sprintf(buf, "Enable safety relay - FAIL (%08x)", Board.ReadStatus());
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable safety relay - PASS (%08x)", Board.ReadStatus());
        }
        Amp1394Console::Print(curLine++, 9, buf);

        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);

        // Turn off safety relay
        Board.WriteSafetyRelay(false);
        Amp1394_Sleep(0.001);
        Port->ReadAllBoards();
        status = Board.GetStatus();
        logFile << "   Disable safety relay: " << std::hex << status;
        if ((status&0x00030000) != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable safety relay - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable safety relay - PASS (%08lx)", status);
        }
        Amp1394Console::Print(curLine++, 9, buf);
    }
    else {
        logFile << "   Skipping safety relay tests for DQLA" << std::endl;
    }

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);

    return pass;
}